

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtHashedSimplePairCache.cpp
# Opt level: O1

cbtSimplePair * __thiscall
cbtHashedSimplePairCache::internalAddPair(cbtHashedSimplePairCache *this,int indexA,int indexB)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  int iVar3;
  cbtSimplePair *ptr;
  int *piVar4;
  undefined8 uVar5;
  uint uVar6;
  cbtSimplePair *pcVar7;
  long lVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  uint uVar12;
  
  uVar6 = indexB << 0x10 | indexA;
  uVar6 = ~(uVar6 << 0xf) + uVar6;
  uVar6 = (uVar6 >> 10 ^ uVar6) * 9;
  uVar6 = uVar6 >> 6 ^ uVar6;
  uVar6 = ~(uVar6 << 0xb) + uVar6;
  uVar6 = uVar6 >> 0x10 ^ uVar6;
  iVar3 = (this->m_overlappingPairArray).m_capacity;
  uVar12 = iVar3 - 1U & uVar6;
  iVar9 = (this->m_hashTable).m_data[(int)uVar12];
  if (iVar9 != -1) {
    pcVar7 = (this->m_overlappingPairArray).m_data;
    do {
      if ((pcVar7[iVar9].m_indexA == indexA) && (pcVar7[iVar9].m_indexB == indexB)) {
        pcVar7 = pcVar7 + iVar9;
        goto LAB_008eef17;
      }
      iVar9 = (this->m_next).m_data[iVar9];
    } while (iVar9 != -1);
  }
  pcVar7 = (cbtSimplePair *)0x0;
LAB_008eef17:
  if (pcVar7 == (cbtSimplePair *)0x0) {
    iVar9 = (this->m_overlappingPairArray).m_size;
    if (iVar9 == iVar3) {
      iVar10 = 1;
      if (iVar9 != 0) {
        iVar10 = iVar9 * 2;
      }
      if (iVar3 < iVar10) {
        if (iVar10 == 0) {
          pcVar7 = (cbtSimplePair *)0x0;
        }
        else {
          pcVar7 = (cbtSimplePair *)cbtAlignedAllocInternal((long)iVar10 << 4,0x10);
        }
        lVar8 = (long)(this->m_overlappingPairArray).m_size;
        if (0 < lVar8) {
          lVar11 = 0;
          do {
            puVar1 = (undefined8 *)
                     ((long)&((this->m_overlappingPairArray).m_data)->m_indexA + lVar11);
            uVar5 = puVar1[1];
            puVar2 = (undefined8 *)((long)&pcVar7->m_indexA + lVar11);
            *puVar2 = *puVar1;
            puVar2[1] = uVar5;
            lVar11 = lVar11 + 0x10;
          } while (lVar8 * 0x10 != lVar11);
        }
        ptr = (this->m_overlappingPairArray).m_data;
        if (ptr != (cbtSimplePair *)0x0) {
          if ((this->m_overlappingPairArray).m_ownsMemory == true) {
            cbtAlignedFreeInternal(ptr);
          }
          (this->m_overlappingPairArray).m_data = (cbtSimplePair *)0x0;
        }
        (this->m_overlappingPairArray).m_ownsMemory = true;
        (this->m_overlappingPairArray).m_data = pcVar7;
        (this->m_overlappingPairArray).m_capacity = iVar10;
      }
    }
    piVar4 = &(this->m_overlappingPairArray).m_size;
    *piVar4 = *piVar4 + 1;
    pcVar7 = (this->m_overlappingPairArray).m_data + iVar9;
    if (iVar3 < (this->m_overlappingPairArray).m_capacity) {
      growTables(this);
      uVar12 = (this->m_overlappingPairArray).m_capacity - 1U & uVar6;
    }
    pcVar7->m_indexA = indexA;
    pcVar7->m_indexB = indexB;
    (pcVar7->field_2).m_userPointer = (void *)0x0;
    piVar4 = (this->m_hashTable).m_data;
    (this->m_next).m_data[iVar9] = piVar4[(int)uVar12];
    piVar4[(int)uVar12] = iVar9;
  }
  return pcVar7;
}

Assistant:

cbtSimplePair* cbtHashedSimplePairCache::internalAddPair(int indexA, int indexB)
{
	int hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity() - 1));  // New hash value with new mask

	cbtSimplePair* pair = internalFindPair(indexA, indexB, hash);
	if (pair != NULL)
	{
		return pair;
	}

	int count = m_overlappingPairArray.size();
	int oldCapacity = m_overlappingPairArray.capacity();
	void* mem = &m_overlappingPairArray.expandNonInitializing();

	int newCapacity = m_overlappingPairArray.capacity();

	if (oldCapacity < newCapacity)
	{
		growTables();
		//hash with new capacity
		hash = static_cast<int>(getHash(static_cast<unsigned int>(indexA), static_cast<unsigned int>(indexB)) & (m_overlappingPairArray.capacity() - 1));
	}

	pair = new (mem) cbtSimplePair(indexA, indexB);

	pair->m_userPointer = 0;

	m_next[count] = m_hashTable[hash];
	m_hashTable[hash] = count;

	return pair;
}